

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall wabt::interp::Thread::DoConvert<float,double>(Thread *this,Ptr *out_trap)

{
  double dVar1;
  float fVar2;
  Value VVar3;
  
  VVar3 = Pop(this);
  dVar1 = (double)VVar3.f64_;
  if (3.4028234663852886e+38 < ABS(dVar1)) {
    if ((dVar1 <= 3.4028234663852886e+38) || (3.4028235677973366e+38 <= dVar1)) {
      if ((dVar1 <= -3.4028235677973366e+38) || (-3.4028234663852886e+38 <= dVar1)) {
        if (NAN(dVar1)) {
          fVar2 = NAN;
        }
        else {
          fVar2 = (float)((uint)(float)dVar1 & 0x80000000 | (uint)DAT_001b48b0);
        }
      }
      else {
        fVar2 = -3.4028235e+38;
      }
    }
    else {
      fVar2 = 3.4028235e+38;
    }
  }
  else {
    fVar2 = (float)dVar1;
  }
  VVar3.i64_._4_4_ = 0;
  VVar3.f32_ = (f32)fVar2;
  Push(this,VVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoConvert(Trap::Ptr* out_trap) {
  auto val = Pop<T>();
  if (std::is_integral<R>::value && std::is_floating_point<T>::value) {
    // Don't use std::isnan here because T may be a non-floating-point type.
    TRAP_IF(IsNaN(val), "invalid conversion to integer");
  }
  TRAP_UNLESS(CanConvert<R>(val), "integer overflow");
  Push<R>(Convert<R>(val));
  return RunResult::Ok;
}